

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void dg::dda::joinDefinitions(Definitions *from,Definitions *to,bool escaping)

{
  DefinitionsMap<dg::dda::RWNode> *this;
  _Hash_node_base _Var1;
  pointer pDVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  DiscreteInterval<dg::Offset> *undefInterv;
  pointer this_00;
  __node_base *p_Var5;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  DefSite local_80;
  Definitions *local_68;
  Definitions *local_60;
  _Rb_tree_node_base *local_58;
  _Rb_tree_node_base *local_50;
  _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_48;
  
  this = &to->definitions;
  p_Var5 = &(from->definitions)._definitions._M_h._M_before_begin;
  local_68 = from;
  local_60 = to;
LAB_0011f1f3:
  p_Var5 = p_Var5->_M_nxt;
  if (p_Var5 == (__node_base *)0x0) {
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&local_60->unknownWrites
               ,(const_iterator)
                (local_60->unknownWrites).
                super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )(local_68->unknownWrites).
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )(local_68->unknownWrites).
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    return;
  }
  if (escaping) goto code_r0x0011f207;
  goto LAB_0011f215;
code_r0x0011f207:
  bVar3 = RWNode::canEscape((RWNode *)p_Var5[1]._M_nxt);
  if (bVar3) {
LAB_0011f215:
    bVar3 = DefinitionsMap<dg::dda::RWNode>::definesTarget(this,(RWNode *)p_Var5[1]._M_nxt);
    if (bVar3) {
      local_58 = (_Rb_tree_node_base *)(p_Var5 + 3);
      p_Var4 = (_Rb_tree_node_base *)p_Var5[5]._M_nxt;
      while (p_Var4 != local_58) {
        _Var1._M_nxt = p_Var5[1]._M_nxt;
        local_80.len = ADT::DiscreteInterval<dg::Offset>::length
                                 ((DiscreteInterval<dg::Offset> *)(p_Var4 + 1));
        local_80.offset.offset = *(type *)(p_Var4 + 1);
        local_80.target = (RWNode *)_Var1._M_nxt;
        DefinitionsMap<dg::dda::RWNode>::undefinedIntervals
                  ((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                    *)&local_48,this,&local_80);
        pDVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
        local_50 = p_Var4;
        for (this_00 = local_48._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar2;
            this_00 = this_00 + 1) {
          _Var1._M_nxt = p_Var5[1]._M_nxt;
          local_80.len = ADT::DiscreteInterval<dg::Offset>::length(this_00);
          local_80.offset.offset = (this_00->start).offset;
          local_80.target = (RWNode *)_Var1._M_nxt;
          DefinitionsMap<dg::dda::RWNode>::
          add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                    (this,&local_80,
                     (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)&p_Var4[1]._M_left);
        }
        std::
        _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ::~_Vector_base(&local_48);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_50);
      }
    }
    else {
      DefinitionsMap<dg::dda::RWNode>::add(this,(RWNode *)p_Var5[1]._M_nxt,(OffsetsT *)(p_Var5 + 2))
      ;
    }
  }
  goto LAB_0011f1f3;
}

Assistant:

static void joinDefinitions(Definitions &from, Definitions &to,
                            bool escaping = false) {
    joinDefinitions(from.definitions, to.definitions, escaping);
    to.unknownWrites.insert(to.unknownWrites.end(), from.unknownWrites.begin(),
                            from.unknownWrites.end());
    // we ignore 'kills' and 'unknownReads' as this function is used
    // only when searching for all definitions
}